

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdPatternColorR5G6B5::~MthdPatternColorR5G6B5(MthdPatternColorR5G6B5 *this)

{
  MthdPatternColorR5G6B5 *this_local;
  
  ~MthdPatternColorR5G6B5(this);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = nv04_pgraph_hswap(&exp, val);
		for (int i = 0; i < 2; i++) {
			uint8_t b = extr(rval, i * 16 + 0, 5) * 0x21 >> 2;
			uint8_t g = extr(rval, i * 16 + 5, 6) * 0x41 >> 4;
			uint8_t r = extr(rval, i * 16 + 11, 5) * 0x21 >> 2;
			exp.pattern_color[idx*2+i] = b | g << 8 | r << 16;
		}
	}